

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O1

int header_odc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  cpio *pcVar1;
  int iVar2;
  int *h;
  ulong uVar3;
  void *pvVar4;
  dev_t dVar5;
  int64_t iVar6;
  long lVar7;
  size_t sVar8;
  byte bVar9;
  int *h_00;
  int *piVar10;
  mode_t mVar11;
  uint nlink;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  ssize_t bytes;
  size_t local_40;
  cpio *local_38;
  
  (a->archive).archive_format = 0x10001;
  (a->archive).archive_format_name = "POSIX octet-oriented cpio";
  local_38 = cpio;
  h = (int *)__archive_read_ahead(a,0x4c,(ssize_t *)&local_40);
  iVar2 = -0x1e;
  bVar14 = true;
  if (h != (int *)0x0) {
    lVar7 = 0;
    do {
      sVar8 = local_40;
      if ((short)h[1] == 0x3730 && *h == 0x37303730) {
        lVar12 = -0x4b;
        do {
          bVar9 = *(char *)((long)h + lVar12 + 0x4b) - 0x38;
          if (bVar9 < 0xf8) break;
          bVar14 = lVar12 != 0;
          lVar12 = lVar12 + 1;
        } while (bVar14);
        if (0xf7 < bVar9) {
          bVar14 = false;
          iVar2 = 0;
          goto LAB_0045f8b2;
        }
      }
      if (((short)h[1] == 0x3732 && *h == 0x37303730) &&
         (iVar2 = is_afio_large((char *)h,local_40), iVar2 != 0)) {
        (a->archive).archive_format = 0x10006;
        bVar14 = false;
        iVar2 = 0;
        goto LAB_0045f8b2;
      }
      piVar10 = h;
      if (0x4b < (long)sVar8) {
        uVar13 = sVar8 + (long)h;
        h_00 = h;
        do {
          if (*(char *)((long)h_00 + 5) == '0') {
            lVar12 = 1;
          }
          else {
            if (*(char *)((long)h_00 + 5) == '7') {
              if ((short)h_00[1] == 0x3730 && *h_00 == 0x37303730) {
                lVar12 = -0x4b;
                do {
                  bVar9 = *(char *)((long)h_00 + lVar12 + 0x4b) - 0x38;
                  if (bVar9 < 0xf8) break;
                  bVar14 = lVar12 != 0;
                  lVar12 = lVar12 + 1;
                } while (bVar14);
                if (bVar9 < 0xf8) goto LAB_0045f79c;
              }
              else {
LAB_0045f79c:
                lVar12 = 2;
                if (((short)h_00[1] != 0x3732 || *h_00 != 0x37303730) ||
                   (iVar2 = is_afio_large((char *)h_00,uVar13 - (long)h_00), iVar2 == 0))
                goto LAB_0045f7d9;
              }
              __archive_read_consume(a,(long)h_00 - (long)h);
              uVar13 = ((long)h_00 - (long)h) + lVar7;
              if ((char)h_00[1] == '2') {
                (a->archive).archive_format = 0x10006;
              }
              if (uVar13 == 0) {
                bVar14 = false;
                iVar2 = 0;
              }
              else {
                archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                                  uVar13 & 0xffffffff);
                bVar14 = false;
                iVar2 = -0x14;
              }
              goto LAB_0045f8b2;
            }
            lVar12 = 6;
          }
LAB_0045f7d9:
          piVar10 = (int *)(lVar12 + (long)h_00);
          uVar3 = (long)h_00 + lVar12 + 0x4c;
          h_00 = piVar10;
        } while (uVar3 <= uVar13);
      }
      __archive_read_consume(a,(long)piVar10 - (long)h);
      lVar7 = lVar7 + ((long)piVar10 - (long)h);
      h = (int *)__archive_read_ahead(a,0x4c,(ssize_t *)&local_40);
    } while (h != (int *)0x0);
    iVar2 = -0x1e;
    bVar14 = true;
  }
LAB_0045f8b2:
  if (bVar14) {
    return iVar2;
  }
  if ((a->archive).archive_format == 0x10006) {
    (a->archive).archive_format = 0x10006;
    (a->archive).archive_format_name = "afio large ASCII";
    pvVar4 = __archive_read_ahead(a,0x74,(ssize_t *)0x0);
    if (pvVar4 == (void *)0x0) {
      return -0x1e;
    }
    dVar5 = atol16((char *)((long)pvVar4 + 6),8);
    archive_entry_set_dev(entry,dVar5);
    iVar6 = atol16((char *)((long)pvVar4 + 0xe),0x10);
    archive_entry_set_ino(entry,iVar6);
    lVar7 = 0;
    mVar11 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar7 + 0x1f);
      if ((bVar9 & 0xf8) != 0x30) break;
      mVar11 = (uint)(byte)(bVar9 - 0x30) + mVar11 * 8;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 6);
    archive_entry_set_mode(entry,mVar11);
    iVar6 = atol16((char *)((long)pvVar4 + 0x25),8);
    archive_entry_set_uid(entry,iVar6);
    iVar6 = atol16((char *)((long)pvVar4 + 0x2d),8);
    archive_entry_set_gid(entry,iVar6);
    iVar6 = atol16((char *)((long)pvVar4 + 0x35),8);
    archive_entry_set_nlink(entry,(uint)iVar6);
    dVar5 = atol16((char *)((long)pvVar4 + 0x3d),8);
    archive_entry_set_rdev(entry,dVar5);
    iVar6 = atol16((char *)((long)pvVar4 + 0x45),0x10);
    archive_entry_set_mtime(entry,iVar6,0);
    sVar8 = atol16((char *)((long)pvVar4 + 0x56),4);
    *namelength = sVar8;
    *name_pad = 0;
    lVar7 = atol16((char *)((long)pvVar4 + 99),0x10);
    iVar6 = 0x74;
  }
  else {
    pvVar4 = __archive_read_ahead(a,0x4c,(ssize_t *)0x0);
    if (pvVar4 == (void *)0x0) {
      return -0x1e;
    }
    lVar7 = 0;
    dVar5 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar7 + 6);
      if ((bVar9 & 0xf8) != 0x30) break;
      dVar5 = (ulong)(byte)(bVar9 - 0x30) + dVar5 * 8;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 6);
    archive_entry_set_dev(entry,dVar5);
    lVar12 = 0;
    lVar7 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar12 + 0xc);
      if ((bVar9 & 0xf8) != 0x30) break;
      lVar7 = (ulong)(byte)(bVar9 - 0x30) + lVar7 * 8;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != 6);
    archive_entry_set_ino(entry,lVar7);
    lVar7 = 0;
    mVar11 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar7 + 0x12);
      if ((bVar9 & 0xf8) != 0x30) break;
      mVar11 = (uint)(byte)(bVar9 - 0x30) + mVar11 * 8;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 6);
    archive_entry_set_mode(entry,mVar11);
    lVar12 = 0;
    lVar7 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar12 + 0x18);
      if ((bVar9 & 0xf8) != 0x30) break;
      lVar7 = (ulong)(byte)(bVar9 - 0x30) + lVar7 * 8;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != 6);
    archive_entry_set_uid(entry,lVar7);
    lVar12 = 0;
    lVar7 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar12 + 0x1e);
      if ((bVar9 & 0xf8) != 0x30) break;
      lVar7 = (ulong)(byte)(bVar9 - 0x30) + lVar7 * 8;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != 6);
    archive_entry_set_gid(entry,lVar7);
    lVar7 = 0;
    nlink = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar7 + 0x24);
      if ((bVar9 & 0xf8) != 0x30) break;
      nlink = (uint)(byte)(bVar9 - 0x30) + nlink * 8;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 6);
    archive_entry_set_nlink(entry,nlink);
    lVar7 = 0;
    dVar5 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar7 + 0x2a);
      if ((bVar9 & 0xf8) != 0x30) break;
      dVar5 = (ulong)(byte)(bVar9 - 0x30) + dVar5 * 8;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 6);
    archive_entry_set_rdev(entry,dVar5);
    lVar12 = 0;
    lVar7 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar12 + 0x30);
      if ((bVar9 & 0xf8) != 0x30) break;
      lVar7 = (ulong)(byte)(bVar9 - 0x30) + lVar7 * 8;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != 0xb);
    lVar12 = 0;
    archive_entry_set_mtime(entry,lVar7,0);
    sVar8 = 0;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar12 + 0x3b);
      if ((bVar9 & 0xf8) != 0x30) break;
      sVar8 = (ulong)(byte)(bVar9 - 0x30) + sVar8 * 8;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != 6);
    *namelength = sVar8;
    *name_pad = 0;
    lVar12 = 0;
    lVar7 = 0;
    iVar6 = 0x4c;
    do {
      bVar9 = *(byte *)((long)pvVar4 + lVar12 + 0x41);
      if ((bVar9 & 0xf8) != 0x30) break;
      lVar7 = (ulong)(byte)(bVar9 - 0x30) + lVar7 * 8;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != 0xb);
  }
  pcVar1 = local_38;
  local_38->entry_bytes_remaining = lVar7;
  archive_entry_set_size(entry,lVar7);
  pcVar1->entry_padding = 0;
  __archive_read_consume(a,iVar6);
  return iVar2;
}

Assistant:

static int
header_odc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	int r;
	const char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX octet-oriented cpio";

	/* Find the start of the next header. */
	r = find_odc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_AFIO_LARGE) {
		int r2 = (header_afiol(a, cpio, entry, namelength, name_pad));
		if (r2 == ARCHIVE_OK)
			return (r);
		else
			return (r2);
	}

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, odc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out octal fields. */
	header = (const char *)h;

	archive_entry_set_dev(entry, 
		(dev_t)atol8(header + odc_dev_offset, odc_dev_size));
	archive_entry_set_ino(entry, atol8(header + odc_ino_offset, odc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol8(header + odc_mode_offset, odc_mode_size));
	archive_entry_set_uid(entry, atol8(header + odc_uid_offset, odc_uid_size));
	archive_entry_set_gid(entry, atol8(header + odc_gid_offset, odc_gid_size));
	archive_entry_set_nlink(entry, 
		(unsigned int)atol8(header + odc_nlink_offset, odc_nlink_size));
	archive_entry_set_rdev(entry,
		(dev_t)atol8(header + odc_rdev_offset, odc_rdev_size));
	archive_entry_set_mtime(entry, atol8(header + odc_mtime_offset, odc_mtime_size), 0);
	*namelength = (size_t)atol8(header + odc_namesize_offset, odc_namesize_size);
	*name_pad = 0; /* No padding of filename. */

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol8(header + odc_filesize_offset, odc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = 0;
	__archive_read_consume(a, odc_header_size);
	return (r);
}